

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

void __thiscall google::protobuf::json_internal::JsonWriter::Write(JsonWriter *this,uint32_t val)

{
  int iVar1;
  char buf [22];
  ulong local_38;
  code *local_30;
  char local_28 [24];
  
  local_38 = (ulong)val;
  local_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
  iVar1 = absl::lts_20240722::str_format_internal::SnprintF(local_28,0x16,"%d",2,&local_38,1);
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,local_28,(long)iVar1);
  return;
}

Assistant:

void Write(uint32_t val) {
    char buf[22];
    int len = absl::SNPrintF(buf, sizeof(buf), "%d", val);
    absl::string_view view(buf, static_cast<size_t>(len));
    Write(view);
  }